

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *pXVar2;
  MemPoolT<72> *in_RSI;
  long in_RDI;
  XMLAttribute *attrib;
  XMLAttribute *last;
  char *in_stack_ffffffffffffffc8;
  XMLAttribute *this_00;
  XMLAttribute *local_18;
  
  local_18 = (XMLAttribute *)0x0;
  pXVar2 = *(XMLAttribute **)(in_RDI + 0x60);
  while (this_00 = pXVar2, this_00 != (XMLAttribute *)0x0) {
    p = XMLAttribute::Name((XMLAttribute *)0x2596f5);
    bVar1 = XMLUtil::StringEqual(p,(char *)in_RSI,0x7fffffff);
    if (bVar1) break;
    local_18 = this_00;
    pXVar2 = this_00->_next;
  }
  pXVar2 = this_00;
  if (this_00 == (XMLAttribute *)0x0) {
    pXVar2 = (XMLAttribute *)MemPoolT<72>::Alloc(in_RSI);
    XMLAttribute::XMLAttribute(this_00);
    pXVar2->_memPool = (MemPool *)(*(long *)(in_RDI + 8) + 0x100);
    if (local_18 == (XMLAttribute *)0x0) {
      *(XMLAttribute **)(in_RDI + 0x60) = pXVar2;
    }
    else {
      local_18->_next = pXVar2;
    }
    XMLAttribute::SetName(pXVar2,in_stack_ffffffffffffffc8);
    (*pXVar2->_memPool->_vptr_MemPool[5])();
  }
  return pXVar2;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
        attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
        attrib->_memPool = &_document->_attributePool;
        if ( last ) {
            last->_next = attrib;
        }
        else {
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
        attrib->_memPool->SetTracked(); // always created and linked.
    }
    return attrib;
}